

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O2

void Omega_h::partition_by_verts(Mesh *mesh,bool verbose)

{
  LO nrroots;
  Write<int> local_2c0;
  Read<long> old_owner_globals;
  undefined1 local_2a0 [48];
  Remotes elem_uses;
  Dist uses2old_owners;
  Dist local_1c0;
  Dist local_130;
  Dist elems2owners;
  
  get_own_verts2own_elems((RemoteGraph *)&uses2old_owners,mesh);
  Remotes::Remotes(&elem_uses,(Remotes *)uses2old_owners.roots2items_);
  RemoteGraph::~RemoteGraph((RemoteGraph *)&uses2old_owners);
  Mesh::comm((Mesh *)local_2a0);
  Remotes::Remotes((Remotes *)(local_2a0 + 0x10),&elem_uses);
  nrroots = Mesh::nelems(mesh);
  Dist::Dist(&uses2old_owners,(CommPtr *)local_2a0,(Remotes *)(local_2a0 + 0x10),nrroots);
  Remotes::~Remotes((Remotes *)(local_2a0 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2a0 + 8));
  Mesh::dim(mesh);
  Mesh::globals((Mesh *)&old_owner_globals,(Int)mesh);
  Dist::Dist(&local_130,&uses2old_owners);
  Write<long>::Write(&local_2c0,(Write<int> *)&old_owner_globals);
  get_new_copies2old_owners(&elems2owners,&local_130,(GOs *)&local_2c0);
  Write<long>::~Write((Write<long> *)&local_2c0);
  Dist::~Dist(&local_130);
  Dist::Dist(&local_1c0,&elems2owners);
  migrate_mesh(mesh,&local_1c0,OMEGA_H_VERT_BASED,verbose);
  Dist::~Dist(&local_1c0);
  Dist::~Dist(&elems2owners);
  Write<long>::~Write(&old_owner_globals.write_);
  Dist::~Dist(&uses2old_owners);
  Remotes::~Remotes(&elem_uses);
  return;
}

Assistant:

void partition_by_verts(Mesh* mesh, bool verbose) {
  /* vertex-based partitioning is defined as gathering the elements
   * adjacent to owned vertices, hence the graph from owned vertices
   * to elements already contains what we need and we can skip push_elem_uses()
   */
  auto elem_uses = get_own_verts2own_elems(mesh).edges2remotes;
  auto uses2old_owners = Dist(mesh->comm(), elem_uses, mesh->nelems());
  auto old_owner_globals = mesh->globals(mesh->dim());
  auto elems2owners =
      get_new_copies2old_owners(uses2old_owners, old_owner_globals);
  migrate_mesh(mesh, elems2owners, OMEGA_H_VERT_BASED, verbose);
}